

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memmon.cpp
# Opt level: O1

monitored_value_map * __thiscall
memmon::get_json_total_stats_abi_cxx11_(monitored_value_map *__return_storage_ptr__,memmon *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
  *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  for (p_Var4 = (this->mem_stats)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->mem_stats)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var2 = p_Var4[5]._M_right;
    pmVar3 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_long>_>_>
             ::operator[](__return_storage_ptr__,(key_type *)(p_Var4 + 1));
    *pmVar3 = (mapped_type)p_Var2;
  }
  return __return_storage_ptr__;
}

Assistant:

prmon::monitored_value_map const memmon::get_json_total_stats() {
  prmon::monitored_value_map mem_max_stat_map{};
  for (const auto& value : mem_stats) {
    mem_max_stat_map[value.first] = value.second.get_max_value();
  }
  return mem_max_stat_map;
}